

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateDescriptorDeclarations
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *this_00;
  int iVar2;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_01;
  MessageGenerator *this_02;
  EnumDescriptor *this_03;
  Printer *pPVar3;
  string local_40;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _i_1 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,
                     "const ::google::protobuf::Descriptor* $name$_descriptor_ = NULL;\nconst ::google::protobuf::internal::GeneratedMessageReflection*\n  $name$_reflection_ = NULL;\n"
                     ,"name",&this->classname_);
  local_1c = 0;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    this_01 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)local_1c);
    this_02 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_01);
    GenerateDescriptorDeclarations(this_02,_i_1);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = local_20;
    iVar2 = Descriptor::enum_type_count(this->descriptor_);
    this_00 = _i_1;
    if (iVar2 <= iVar1) break;
    pPVar3 = _i_1;
    this_03 = Descriptor::enum_type(this->descriptor_,local_20);
    ClassName_abi_cxx11_(&local_40,(cxx *)this_03,(EnumDescriptor *)0x0,SUB81(pPVar3,0));
    io::Printer::Print(this_00,
                       "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
                       "name",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDescriptorDeclarations(io::Printer* printer) {
  printer->Print(
    "const ::google::protobuf::Descriptor* $name$_descriptor_ = NULL;\n"
    "const ::google::protobuf::internal::GeneratedMessageReflection*\n"
    "  $name$_reflection_ = NULL;\n",
    "name", classname_);

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateDescriptorDeclarations(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    printer->Print(
      "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
      "name", ClassName(descriptor_->enum_type(i), false));
  }
}